

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
          (xr_reader *this,
          vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *container,
          f_r_new<xray_re::xr_bone> read)

{
  reference p;
  value_type local_40;
  uint32_t local_34;
  xr_reader *pxStack_30;
  uint32_t id;
  xr_reader *s;
  vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *container_local;
  xr_reader *this_local;
  f_r_new<xray_re::xr_bone> read_local;
  
  local_34 = 0;
  s = (xr_reader *)container;
  container_local = (vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)this;
  while( true ) {
    pxStack_30 = open_chunk(this,local_34);
    if (pxStack_30 == (xr_reader *)0x0) break;
    local_40 = (value_type)0x0;
    std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::push_back
              ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)s,&local_40);
    p = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::back
                  ((vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *)s);
    f_r_new<xray_re::xr_bone>::operator()((f_r_new<xray_re::xr_bone> *)&this_local,p,pxStack_30);
    close_chunk(this,&stack0xffffffffffffffd0);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}